

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

Script * __thiscall
cfd::core::AbstractTransaction::SetUnlockingScript
          (Script *__return_storage_ptr__,AbstractTransaction *this,uint32_t tx_in_index,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_script)

{
  pointer pBVar1;
  Script *__return_storage_ptr___00;
  pointer __x;
  ScriptBuilder builder;
  ByteData script;
  ScriptBuilder local_90;
  Script *local_70;
  Script local_68;
  
  local_70 = __return_storage_ptr__;
  (*this->_vptr_AbstractTransaction[0xb])(this,(ulong)tx_in_index,0x1a6,"SetUnlockingScript");
  local_90._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_0067f268;
  local_90.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (unlocking_script->
        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pBVar1 = (unlocking_script->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__x != pBVar1) {
    do {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&__x->data_);
      ScriptBuilder::AppendData(&local_90,(ByteData *)&local_68);
      if (local_68._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_68._vptr_Script);
      }
      __x = __x + 1;
    } while (__x != pBVar1);
  }
  ScriptBuilder::Build(&local_68,&local_90);
  SetUnlockingScript(this,tx_in_index,&local_68);
  __return_storage_ptr___00 = local_70;
  Script::~Script(&local_68);
  ScriptBuilder::Build(__return_storage_ptr___00,&local_90);
  local_90._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_0067f268;
  if (local_90.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr___00;
}

Assistant:

Script AbstractTransaction::SetUnlockingScript(
    uint32_t tx_in_index, const std::vector<ByteData> &unlocking_script) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  ScriptBuilder builder;
  for (ByteData script : unlocking_script) {
    builder.AppendData(script);
  }
  SetUnlockingScript(tx_in_index, builder.Build());
  return builder.Build();
}